

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_getEdgeArray(RDL_data *data,RDL_edge **ptr)

{
  RDL_graph *pRVar1;
  RDL_node *pRVar2;
  uint uVar3;
  RDL_edge *paRVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    paRVar4 = (RDL_edge *)malloc(8);
    *ptr = paRVar4;
    uVar3 = 0xffffffff;
  }
  else {
    pRVar1 = data->graph;
    uVar6 = (ulong)pRVar1->E;
    paRVar4 = (RDL_edge *)malloc(uVar6 * 8);
    for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
      pRVar2 = pRVar1->edges[uVar5];
      paRVar4[uVar5][0] = *pRVar2;
      paRVar4[uVar5][1] = pRVar2[1];
    }
    *ptr = paRVar4;
    uVar3 = data->graph->E;
  }
  return uVar3;
}

Assistant:

unsigned RDL_getEdgeArray(const RDL_data *data, RDL_edge **ptr)
{
  RDL_edge *result;
  unsigned idx;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  result = malloc(data->graph->E * sizeof(*result));
  for(idx=0; idx<data->graph->E; ++idx)
  {
    result[idx][0] = data->graph->edges[idx][0];
    result[idx][1] = data->graph->edges[idx][1];
  }
  (*ptr) = result;
  return data->graph->E;
}